

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputOpenStuff(Node *this,ostream *os,Node *Channel)

{
  Node *pNVar1;
  ostream *poVar2;
  int iVar3;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  string local_48;
  
  iVar3 = this->Type;
  if (iVar3 < 0x161) {
    if (0x119 < iVar3) {
      if (iVar3 < 0x127) {
        if (iVar3 == 0x11a) {
          iVar3 = 0;
          if (0 < Level) {
            iVar3 = Level;
          }
          local_88 = local_78;
          std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
          GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetClusterSize(",0x10);
          Expression_abi_cxx11_(&local_68,this->Tree[0]);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
        else {
          if (iVar3 == 0x11e) {
            iVar3 = 0;
            if (0 < Level) {
              iVar3 = Level;
            }
            local_88 = local_78;
            std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(char *)local_88,local_80);
            GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetContiguous(True);",0x15);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
            goto LAB_0011cec0;
          }
          if (iVar3 != 0x120) goto switchD_0011ba17_caseD_103;
          iVar3 = 0;
          if (0 < Level) {
            iVar3 = Level;
          }
          local_88 = local_78;
          std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
          GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".SetConnect(BasicChannel[",0x19);
          Expression_abi_cxx11_(&local_68,this->Tree[0]);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]);",3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
      }
      else if (iVar3 == 0x127) {
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetDefaultName(",0x10);
        Expression_abi_cxx11_(&local_68,this->Tree[0]);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      else if (iVar3 == 0x136) {
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetExtendSize(",0xf);
        Expression_abi_cxx11_(&local_68,this->Tree[0]);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      else {
        if (iVar3 != 0x13a) goto switchD_0011ba17_caseD_103;
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetFileSize(",0xd);
        Expression_abi_cxx11_(&local_68,this->Tree[0]);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      goto LAB_0011cea5;
    }
    switch(iVar3) {
    case 0x102:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetAccess(",0xb);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(this->Tree[0]->TextValue)._M_dataplus._M_p,
                          (this->Tree[0]->TextValue)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      goto LAB_0011cec0;
    default:
      goto switchD_0011ba17_caseD_103;
    case 0x104:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetAllow(",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(this->Tree[0]->TextValue)._M_dataplus._M_p,
                          (this->Tree[0]->TextValue)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      goto LAB_0011cec0;
    case 0x105:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetKey(",8);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      break;
    case 0x10c:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetBlockSize(",0xe);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      break;
    case 0x10d:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetBucketSize(",0xf);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      break;
    case 0x10e:
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetBuffer(",0xb);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    goto LAB_0011cea5;
  }
  if (0x183 < iVar3) {
    if (iVar3 < 0x1a5) {
      if (iVar3 == 0x184) {
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRecordType(",0xf);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(this->Tree[0]->TextValue)._M_dataplus._M_p,
                            (this->Tree[0]->TextValue)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      else {
        if (iVar3 == 0x185) {
          iVar3 = 0;
          if (0 < Level) {
            iVar3 = Level;
          }
          local_88 = local_78;
          std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
          GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRecordSize(",0xf);
          Expression_abi_cxx11_(&local_68,this->Tree[0]);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          goto LAB_0011cea5;
        }
        if (iVar3 != 0x19c) goto switchD_0011ba17_caseD_103;
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetSpan(True);",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
    }
    else {
      if (iVar3 != 0x1a5) {
        if (iVar3 == 0x1b5) goto LAB_0011cef2;
        if (iVar3 != 0x1b9) goto switchD_0011ba17_caseD_103;
        iVar3 = 0;
        if (0 < Level) {
          iVar3 = Level;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
        GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetWindowSize(",0xf);
        Expression_abi_cxx11_(&local_68,this->Tree[0]);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        goto LAB_0011cea5;
      }
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetTemporary(True);",0x14);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    goto LAB_0011cec0;
  }
  switch(iVar3) {
  case 0x170:
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
    GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRewind(False);",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    goto LAB_0011cec0;
  case 0x171:
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
    GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetSpan(False);",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    goto LAB_0011cec0;
  case 0x172:
  case 0x173:
  case 0x174:
  case 0x176:
  case 0x177:
  case 0x178:
switchD_0011ba17_caseD_103:
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
    GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".GoofyOpenStuff(",0x10);
    Expression_abi_cxx11_(&local_68,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    break;
  case 0x175:
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
    GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetOrginization(",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->Tree[0]->TextValue)._M_dataplus._M_p,
               (this->Tree[0]->TextValue)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (this->Tree[0]->Tree[0] != (Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      pNVar1 = this->Tree[0]->Tree[0];
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(pNVar1->TextValue)._M_dataplus._M_p,(pNVar1->TextValue)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    goto LAB_0011cef2;
  case 0x179:
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
    GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetKey(",8);
    Expression_abi_cxx11_(&local_68,this->Tree[0]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    break;
  default:
    if (iVar3 == 0x161) {
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetMap(",8);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", sizeof(",9);
      Expression_abi_cxx11_(&local_48,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"));",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (iVar3 != 0x166) goto switchD_0011ba17_caseD_103;
      iVar3 = 0;
      if (0 < Level) {
        iVar3 = Level;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
      GetIPChannel_abi_cxx11_(&local_a8,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetMode(",9);
      Expression_abi_cxx11_(&local_68,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
LAB_0011cea5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0011cec0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_0011cef2:
  if (this->Block[0] != (Node *)0x0) {
    OutputOpenStuff(this->Block[0],os,Channel);
  }
  return;
}

Assistant:

void Node::OutputOpenStuff(
	std::ostream& os,	/**< iosream to write C++ code to */
	Node* Channel		/**< Basic IO channel */
)
{
	switch(Type)
	{
	case BAS_S_RECORDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordSize(" << Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_CLUSTERSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetClusterSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_FILESIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetFileSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_EXTENDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetExtendSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_WINDOWSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetWindowSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BLOCKSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBlockSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUCKETSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBucketSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_MODE:

		os << Indent() <<
			GetIPChannel(Channel, 0)<<
			".SetMode(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUFFER:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBuffer(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_DEFAULTNAME:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetDefaultName(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_PRIMARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_ALTERNATE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_TEMPORARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetTemporary(True);" << std::endl;
		break;

	case BAS_S_CONTIGUOUS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetContiguous(True);" << std::endl;
		break;

	case BAS_S_NOREWIND:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRewind(False);" << std::endl;
		break;

	case BAS_S_NOSPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(False);" << std::endl;
		break;

	case BAS_S_SPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(True);" << std::endl;
		break;

	case BAS_S_ORGANIZATION:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetOrginization(" << Tree[0]->TextValue;
		if (Tree[0]->Tree[0] != 0)
		{
			os << ", " << Tree[0]->Tree[0]->TextValue;
		}
		os << ");" << std::endl;
		break;

	case BAS_S_ACCESS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAccess(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_ALLOW:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAllow(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_CONNECT:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetConnect(BasicChannel[" << Tree[0]->Expression() << "]);" <<
			std::endl;
		break;

	case BAS_S_MAP:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetMap(" << Tree[0]->Expression() << ", sizeof(" <<
			Tree[0]->Expression() <<
			"));" << std::endl;
		break;

	case BAS_S_RECORDTYPE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordType(" << Tree[0]->TextValue <<
			");" << std::endl;
		break;

	case BAS_S_VIRTUAL:
		break;

	default:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".GoofyOpenStuff(" << Expression() << ");" <<
			std::endl;
		break;

	}

	//
	// Handle downlink
	//
	if (Block[0] != 0)
	{
		Block[0]->OutputOpenStuff(os, Channel);
	}
}